

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicBasicTestInstance *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar5;
  SharedPtrStateBase *pSVar6;
  VkImage VVar7;
  VkImageView VVar8;
  VkRenderPass obj;
  VkFramebuffer obj_00;
  VkSubpassDescription subpass;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  Handle<(vk::HandleType)23> HVar9;
  VkAllocationCallbacks *pVVar10;
  undefined8 uVar11;
  void *pvVar12;
  undefined8 uVar13;
  Handle<(vk::HandleType)13> HVar14;
  DeviceInterface *pDVar15;
  VkDevice pVVar16;
  DeviceInterface *pDVar17;
  VkDevice pVVar18;
  Allocator *pAVar19;
  long lVar20;
  ImageCreateInfo *pIVar21;
  undefined8 *puVar22;
  byte bVar23;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  VkStructureType VVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  VkImageCreateFlags VVar36;
  VkImageType VVar37;
  VkFormat VVar38;
  deUint32 dVar39;
  deUint32 dVar40;
  undefined4 uVar41;
  Move<vk::Handle<(vk::HandleType)23>_> local_278;
  ImageViewCreateInfo depthViewInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_208;
  ImageCreateInfo depthImageCreateInfo;
  ImageViewCreateInfo attachmentViewInfo;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  ImageCreateInfo colorImageCreateInfo;
  
  bVar23 = 0;
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  pDVar17 = Context::getDeviceInterface
                      ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  pVVar18 = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context
                              );
  _extent.depth = 1;
  _extent.width = 0x40;
  _extent.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&colorImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar19 = Context::getDefaultAllocator
                      ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthImageCreateInfo,pDVar17,pVVar18,
             &colorImageCreateInfo.super_VkImageCreateInfo,pAVar19,(MemoryRequirement)0x0);
  pSVar6 = (this->m_colorAttachmentImage).m_state;
  if (pSVar6 == (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext) {
LAB_006d672e:
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0)) {
        (**(code **)(*depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8))();
      }
    }
  }
  else {
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar6->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_colorAttachmentImage).m_ptr = (Image *)0x0;
        (*((this->m_colorAttachmentImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar6 = (this->m_colorAttachmentImage).m_state;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_colorAttachmentImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_colorAttachmentImage).m_ptr =
         (Image *)depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_colorAttachmentImage).m_state =
         (SharedPtrStateBase *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthImageCreateInfo.super_VkImageCreateInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) =
           *(int *)((long)depthImageCreateInfo.super_VkImageCreateInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_colorAttachmentImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      goto LAB_006d672e;
    }
  }
  VVar7.m_internal =
       (((this->m_colorAttachmentImage).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  VVar38 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&depthImageCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar7,VK_IMAGE_VIEW_TYPE_2D,VVar38,
             (VkComponentMapping *)&depthImageCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo,pDVar17,pVVar18,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  VVar7 = depthViewInfo.super_VkImageViewCreateInfo.image;
  uVar13 = depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  pvVar12 = depthViewInfo.super_VkImageViewCreateInfo.pNext;
  uVar11 = depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  pMVar3 = &this->m_attachmentView;
  VVar8.m_internal =
       (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar8.m_internal == 0) {
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar13;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar7.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar11;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar8);
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
    (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &depthViewInfo.super_VkImageViewCreateInfo.pNext,
                 (VkImageView)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
    }
  }
  uVar28 = 0;
  uVar29 = 0;
  uVar26 = 1;
  uVar27 = 0;
  uVar24 = 1;
  uVar25 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x40;
  _extent_00.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthImageCreateInfo,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent_00,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar19 = Context::getDefaultAllocator
                      ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthViewInfo,pDVar17,pVVar18,&depthImageCreateInfo.super_VkImageCreateInfo,
             pAVar19,(MemoryRequirement)0x0);
  pSVar6 = (this->m_depthImage).m_state;
  if (pSVar6 != (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext) {
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar6->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_depthImage).m_ptr = (Image *)0x0;
        (*((this->m_depthImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_depthImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar6 = (this->m_depthImage).m_state;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_depthImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_depthImage).m_ptr = (Image *)depthViewInfo.super_VkImageViewCreateInfo._0_8_;
    (this->m_depthImage).m_state =
         (SharedPtrStateBase *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo.pNext == (void *)0x0) goto LAB_006d6984;
    LOCK();
    *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) =
         *(int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8) + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_depthImage).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  if (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar2 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 8);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
      (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)depthViewInfo.super_VkImageViewCreateInfo.pNext + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (depthViewInfo.super_VkImageViewCreateInfo.pNext != (void *)0x0)) {
      (**(code **)(*depthViewInfo.super_VkImageViewCreateInfo.pNext + 8))();
    }
  }
LAB_006d6984:
  VVar7.m_internal =
       (((this->m_depthImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data
       .object.m_internal;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_278,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&depthViewInfo,VVar7,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             (VkComponentMapping *)&local_278,0);
  ::vk::createImageView
            (&local_208,pDVar17,pVVar18,&depthViewInfo.super_VkImageViewCreateInfo,
             (VkAllocationCallbacks *)0x0);
  pVVar10 = local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar16 = local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar15 = local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar14.m_internal =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar4 = &this->m_depthiew;
  VVar8.m_internal =
       (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  if (VVar8.m_internal == 0) {
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         pVVar16;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         pVVar10;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         HVar14.m_internal;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         pDVar15;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               VVar8);
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
    (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
    if (local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  if (depthImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depthImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)depthImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (colorImageCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorImageCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)colorImageCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)&colorImageCreateInfo,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  attachment.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment);
  uVar41 = 0;
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  VVar36 = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  VVar37 = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  VVar38 = depthImageCreateInfo.super_VkImageCreateInfo.format;
  dVar39 = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  VVar32 = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  uVar33 = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  uVar34 = SUB84(depthImageCreateInfo.super_VkImageCreateInfo.pNext,0);
  uVar35 = (undefined4)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  uVar30 = 0x6d6b8f;
  uVar31 = 0;
  attachment_00.samples = uVar34;
  attachment_00.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment_00.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment_00.loadOp = uVar35;
  attachment_00.storeOp = VVar36;
  attachment_00.stencilLoadOp = VVar37;
  attachment_00.stencilStoreOp = VVar38;
  attachment_00.initialLayout = dVar39;
  attachment_00.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  dVar40 = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment_00);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  depthAttachmentReference.attachment = 1;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       (void *)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext & 0xffffffff00000000);
  depthImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  depthImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_R4G4_UNORM_PACK8;
  depthImageCreateInfo.super_VkImageCreateInfo.extent._4_8_ = &colorAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.mipLevels = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.arrayLayers = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._48_8_ = &depthAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.usage = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.queueFamilyIndexCount = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._68_4_ = 0;
  pIVar21 = &depthImageCreateInfo;
  puVar22 = (undefined8 *)&stack0xfffffffffffffd38;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    *puVar22 = *(undefined8 *)&pIVar21->super_VkImageCreateInfo;
    pIVar21 = (ImageCreateInfo *)((long)pIVar21 + (ulong)bVar23 * -0x10 + 8);
    puVar22 = puVar22 + (ulong)bVar23 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar25;
  subpass.flags = uVar24;
  subpass.inputAttachmentCount = uVar26;
  subpass._12_4_ = uVar27;
  subpass.pInputAttachments._0_4_ = uVar28;
  subpass.pInputAttachments._4_4_ = uVar29;
  subpass.colorAttachmentCount = uVar30;
  subpass._28_4_ = uVar31;
  subpass.pColorAttachments._0_4_ = VVar32;
  subpass.pColorAttachments._4_4_ = uVar33;
  subpass.pResolveAttachments._0_4_ = uVar34;
  subpass.pResolveAttachments._4_4_ = uVar35;
  subpass.pDepthStencilAttachment._0_4_ = VVar36;
  subpass.pDepthStencilAttachment._4_4_ = VVar37;
  subpass.preserveAttachmentCount = VVar38;
  subpass._60_4_ = dVar39;
  subpass.pPreserveAttachments._0_4_ = dVar40;
  subpass.pPreserveAttachments._4_4_ = uVar41;
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)&colorImageCreateInfo,subpass);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&depthViewInfo,pDVar17,pVVar18,
             (VkRenderPassCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  VVar7 = depthViewInfo.super_VkImageViewCreateInfo.image;
  uVar13 = depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  pvVar12 = depthViewInfo.super_VkImageViewCreateInfo.pNext;
  uVar11 = depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  attachmentViewInfo.super_VkImageViewCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.image =
       depthViewInfo.super_VkImageViewCreateInfo.image;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  pMVar5 = &this->m_renderPass;
  obj.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)uVar13;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar7.m_internal;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal = uVar11;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
    if (depthViewInfo.super_VkImageViewCreateInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)
                 &depthViewInfo.super_VkImageViewCreateInfo.pNext,
                 (VkRenderPass)depthViewInfo.super_VkImageViewCreateInfo._0_8_);
    }
  }
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       (deUint64)operator_new(0x10);
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal + 0x10);
  *(deUint64 *)local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  *(deUint64 *)
   (local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal + 8) =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)
       local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)&attachmentViewInfo,
             (VkRenderPass)
             (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              *)&local_208,0x40,0x40,1);
  ::vk::createFramebuffer
            (&local_278,pDVar17,pVVar18,(VkFramebufferCreateInfo *)&attachmentViewInfo,
             (VkAllocationCallbacks *)0x0);
  pVVar10 = local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  pVVar18 = local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  pDVar17 = local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  HVar9.m_internal =
       local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  depthViewInfo.super_VkImageViewCreateInfo._16_8_ =
       local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal =
       (deUint64)local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
  ;
  depthViewInfo.super_VkImageViewCreateInfo._0_8_ =
       local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  depthViewInfo.super_VkImageViewCreateInfo.pNext =
       local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_00.m_internal == 0) {
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         pVVar18;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = pVVar10;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         HVar9.m_internal;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = pDVar17;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_00);
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         (VkDevice)depthViewInfo.super_VkImageViewCreateInfo._16_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         depthViewInfo.super_VkImageViewCreateInfo._0_8_;
    (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
    if (local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                (&local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
                 (VkFramebuffer)
                 local_278.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
    }
  }
  if ((deUint64 *)local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
      != (deUint64 *)0x0) {
    operator_delete((void *)local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                            m_internal,
                    (long)local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                          m_device -
                    local_208.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                    m_internal);
  }
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)&colorImageCreateInfo);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[5])
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicBasicTestInstance::iterate (void)
{
	checkExtensions();
	creatColorAttachmentAndRenderPass();
	createPipeline();
	return executeTest();
}